

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Prim>::operator=
          (optional<tinyusdz::Prim> *this,optional<tinyusdz::Prim> *other)

{
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      tinyusdz::Prim::~Prim((Prim *)&this->contained);
      this->has_value_ = false;
      return this;
    }
  }
  else {
    if (other->has_value_ == true) {
      initialize<tinyusdz::Prim>(this,(Prim *)&other->contained);
      return this;
    }
    if (this->has_value_ == false) {
      return this;
    }
  }
  if (other->has_value_ == true) {
    tinyusdz::Path::operator=((Path *)&this->contained,(Path *)&other->contained);
    tinyusdz::Path::operator=
              ((Path *)((long)&this->contained + 0xd0),(Path *)((long)&other->contained + 0xd0));
    tinyusdz::Path::operator=
              ((Path *)((long)&this->contained + 0x1a0),(Path *)((long)&other->contained + 0x1a0));
    std::__cxx11::string::operator=
              ((string *)((long)&this->contained + 0x270),
               (string *)((long)&other->contained + 0x270));
    *(undefined4 *)((long)&this->contained + 0x290) =
         *(undefined4 *)((long)&other->contained + 0x290);
    linb::any::operator=
              ((any *)((long)&this->contained + 0x298),(any *)((long)&other->contained + 0x298));
    std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::_M_move_assign
              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
               ((long)&this->contained + 0x2b0),(undefined1 *)((long)&other->contained + 0x2b0));
    std::
    multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&this->contained + 0x2c8),
                (multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&other->contained + 0x2c8));
    *(undefined2 *)((long)&this->contained + 0x2f8) =
         *(undefined2 *)((long)&other->contained + 0x2f8);
    std::vector<long,_std::allocator<long>_>::_M_move_assign
              ((vector<long,_std::allocator<long>_> *)((long)&this->contained + 0x300),
               (undefined1 *)((long)&other->contained + 0x300));
    *(undefined8 *)((long)&this->contained + 0x318) =
         *(undefined8 *)((long)&other->contained + 0x318);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
    ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                 *)((long)&this->contained + 800),
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                 *)((long)&other->contained + 800));
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }